

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform_authentication(connectdata *conn)

{
  imapstate local_48;
  imapstate local_44;
  imapstate state2;
  imapstate state1;
  size_t len;
  char *initresp;
  char *mech;
  imap_conn *imapc;
  connectdata *pcStack_18;
  CURLcode result;
  connectdata *conn_local;
  
  imapc._4_4_ = CURLE_OK;
  mech = (char *)&conn->proto;
  initresp = (char *)0x0;
  len = 0;
  _state2 = 0;
  local_44 = IMAP_STOP;
  local_48 = IMAP_STOP;
  pcStack_18 = conn;
  if (((conn->bits).user_passwd & 1U) == 0) {
    state(conn,IMAP_STOP);
    conn_local._4_4_ = imapc._4_4_;
  }
  else {
    imapc._4_4_ = imap_calc_sasl_details
                            (conn,&initresp,(char **)&len,(size_t *)&state2,&local_44,&local_48);
    if (imapc._4_4_ == CURLE_OK) {
      if ((initresp == (char *)0x0) || ((*(uint *)(mech + 0x7c) & 2) == 0)) {
        if (((mech[0x92] & 1U) == 0) && ((*(uint *)(mech + 0x7c) & 1) != 0)) {
          imapc._4_4_ = imap_perform_login(pcStack_18);
        }
        else {
          Curl_infof(pcStack_18->data,"No known authentication mechanisms supported!\n");
          imapc._4_4_ = CURLE_LOGIN_DENIED;
        }
      }
      else {
        imapc._4_4_ = imap_perform_authenticate(pcStack_18,initresp,(char *)len,local_44,local_48);
        if (len != 0) {
          (*Curl_cfree)((void *)len);
        }
      }
    }
    conn_local._4_4_ = imapc._4_4_;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode imap_perform_authentication(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;
  const char *mech = NULL;
  char *initresp = NULL;
  size_t len = 0;
  imapstate state1 = IMAP_STOP;
  imapstate state2 = IMAP_STOP;

  /* Check we have a username and password to authenticate with and end the
     connect phase if we don't */
  if(!conn->bits.user_passwd) {
    state(conn, IMAP_STOP);

    return result;
  }

  /* Calculate the SASL login details */
  result = imap_calc_sasl_details(conn, &mech, &initresp, &len, &state1,
                                  &state2);

  if(!result) {
    if(mech && (imapc->preftype & IMAP_TYPE_SASL)) {
      /* Perform SASL based authentication */
      result = imap_perform_authenticate(conn, mech, initresp, state1, state2);

      Curl_safefree(initresp);
    }
    else if((!imapc->login_disabled) &&
            (imapc->preftype & IMAP_TYPE_CLEARTEXT))
      /* Perform clear text authentication */
      result = imap_perform_login(conn);
    else {
      /* Other mechanisms not supported */
      infof(conn->data, "No known authentication mechanisms supported!\n");
      result = CURLE_LOGIN_DENIED;
    }
  }

  return result;
}